

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.H
# Opt level: O2

FabArray<amrex::BaseFab<long>_> * __thiscall
amrex::cast<amrex::FabArray<amrex::BaseFab<long>>,amrex::iMultiFab>
          (FabArray<amrex::BaseFab<long>_> *__return_storage_ptr__,amrex *this,iMultiFab *mf_in)

{
  int iVar1;
  undefined1 auVar2 [16];
  Long LVar3;
  long *plVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  MFIter mfi;
  undefined1 local_b8 [16];
  undefined1 auStack_a8 [16];
  int aiStack_98 [2];
  int local_90;
  Vector<int,_std::allocator<int>_> *local_78;
  FabFactory<amrex::BaseFab<long>_> local_58;
  Box local_50;
  
  local_50.smallend.vect._0_8_ = *(undefined8 *)(this + 0xc0);
  local_50.smallend.vect[2] = *(int *)(this + 200);
  local_b8._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  stack0xffffffffffffff50 = (undefined1  [16])0x0;
  stack0xffffffffffffff60 = (undefined1  [16])0x0;
  local_58._vptr_FabFactory = (_func_int **)&PTR__FabFactory_007d4108;
  FabArray<amrex::BaseFab<long>_>::FabArray
            (__return_storage_ptr__,(BoxArray *)(this + 8),(DistributionMapping *)(this + 0x70),
             *(int *)(this + 0xcc),&local_50.smallend,(MFInfo *)local_b8,&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_a8);
  MFIter::MFIter((MFIter *)local_b8,(FabArrayBase *)this,'\0');
  while (aiStack_98[0] < local_90) {
    MFIter::fabbox(&local_50,(MFIter *)local_b8);
    LVar3 = Box::numPts(&local_50);
    piVar5 = aiStack_98;
    if (local_78 != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar5 = (local_78->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + aiStack_98[0];
    }
    iVar1 = *(int *)(this + 0xcc);
    plVar4 = BaseFab<long>::dataPtr
                       ((__return_storage_ptr__->m_fabs_v).
                        super__Vector_base<amrex::BaseFab<long>_*,_std::allocator<amrex::BaseFab<long>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[*piVar5],0);
    piVar5 = aiStack_98;
    if (local_78 != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar5 = (local_78->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + aiStack_98[0];
    }
    lVar7 = LVar3 * iVar1;
    piVar5 = BaseFab<int>::dataPtr
                       (*(BaseFab<int> **)(*(long *)(this + 0x108) + (long)*piVar5 * 8),0);
    auVar2 = _DAT_006f8e90;
    if (0 < lVar7) {
      lVar8 = lVar7 + -1;
      auVar9._8_4_ = (int)lVar8;
      auVar9._0_8_ = lVar8;
      auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar9 = auVar9 ^ _DAT_006f8e90;
      uVar6 = 0;
      auVar10 = _DAT_006f8e80;
      do {
        auVar11 = auVar10 ^ auVar2;
        if ((bool)(~(auVar9._4_4_ < auVar11._4_4_ ||
                    auVar9._0_4_ < auVar11._0_4_ && auVar11._4_4_ == auVar9._4_4_) & 1)) {
          plVar4[uVar6] = (long)piVar5[uVar6];
        }
        if (auVar11._12_4_ <= auVar9._12_4_ &&
            (auVar11._8_4_ <= auVar9._8_4_ || auVar11._12_4_ != auVar9._12_4_)) {
          plVar4[uVar6 + 1] = (long)piVar5[uVar6 + 1];
        }
        uVar6 = uVar6 + 2;
        lVar8 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar8 + 2;
      } while ((lVar7 + 1U & 0xfffffffffffffffe) != uVar6);
    }
    MFIter::operator++((MFIter *)local_b8);
  }
  MFIter::~MFIter((MFIter *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

T cast (U const& mf_in)
    {
        T mf_out(mf_in.boxArray(), mf_in.DistributionMap(), mf_in.nComp(), mf_in.nGrowVect());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mf_in); mfi.isValid(); ++mfi)
        {
            const Long n = mfi.fabbox().numPts() * mf_in.nComp();
            auto pdst = mf_out[mfi].dataPtr();
            auto psrc = mf_in [mfi].dataPtr();
            AMREX_HOST_DEVICE_PARALLEL_FOR_1D ( n, i,
            {
                pdst[i] = static_cast<typename U::value_type>(psrc[i]);
            });
        }
        return mf_out;
    }